

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairResponsePdu.cpp
# Opt level: O2

void __thiscall DIS::RepairResponsePdu::unmarshal(RepairResponsePdu *this,DataStream *dataStream)

{
  LogisticsFamilyPdu::unmarshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_receivingEntityID,dataStream);
  EntityID::unmarshal(&this->_repairingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_repairResult);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_padding2);
  return;
}

Assistant:

void RepairResponsePdu::unmarshal(DataStream& dataStream)
{
    LogisticsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _receivingEntityID.unmarshal(dataStream);
    _repairingEntityID.unmarshal(dataStream);
    dataStream >> _repairResult;
    dataStream >> _padding1;
    dataStream >> _padding2;
}